

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lj_state_free(global_State *g,lua_State *L)

{
  uint uVar1;
  void *pvVar2;
  lua_State *L_local;
  global_State *g_local;
  
  if (L == (lua_State *)(g->cur_L).gcptr64) {
    (g->cur_L).gcptr64 = 0;
  }
  lj_func_closeuv(L,(TValue *)(L->stack).ptr64);
  pvVar2 = (void *)(L->stack).ptr64;
  uVar1 = L->stacksize;
  (g->gc).total = (g->gc).total + (ulong)uVar1 * -8;
  (*g->allocf)(g->allocd,pvVar2,(ulong)uVar1 * 8,0);
  (g->gc).total = (g->gc).total - 0x70;
  (*g->allocf)(g->allocd,L,0x70,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_state_free(global_State *g, lua_State *L)
{
  lj_assertG(L != mainthread(g), "free of main thread");
  if (obj2gco(L) == gcref(g->cur_L))
    setgcrefnull(g->cur_L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_assertG(gcref(L->openupval) == NULL, "stale open upvalues");
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
  lj_mem_freet(g, L);
}